

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall
pugi::xml_node::insert_copy_before(xml_node *this,xml_node *proto,xml_node *node)

{
  ulong uVar1;
  xml_allocator *this_00;
  xml_node_struct *pxVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  xml_memory_page *in_RAX;
  xml_node_struct *pxVar5;
  xml_node_struct **ppxVar6;
  uint uVar7;
  uint uVar8;
  xml_memory_page *local_28;
  
  if (proto->_root == (xml_node_struct *)0x0) {
    uVar8 = 0;
  }
  else {
    uVar8 = (uint)proto->_root->header & 0xf;
  }
  pxVar5 = this->_root;
  if (pxVar5 != (xml_node_struct *)0x0) {
    if (uVar8 < 2) {
      return (xml_node)(xml_node_struct *)0x0;
    }
    uVar7 = (uint)pxVar5->header & 0xf;
    if (uVar7 - 3 < 0xfffffffe) {
      return (xml_node)(xml_node_struct *)0x0;
    }
    if (((uVar8 - 9 < 0xfffffffe || uVar7 == 1) && (node->_root != (xml_node_struct *)0x0)) &&
       (node->_root->parent == pxVar5)) {
      this_00 = *(xml_allocator **)((long)pxVar5 - (pxVar5->header >> 8));
      uVar1 = this_00->_busy_size + 0x40;
      if (uVar1 < 0x7fd9) {
        local_28 = this_00->_root;
        pxVar5 = (xml_node_struct *)((long)&local_28[1].allocator + this_00->_busy_size);
        this_00->_busy_size = uVar1;
      }
      else {
        local_28 = in_RAX;
        pxVar5 = (xml_node_struct *)
                 impl::anon_unknown_0::xml_allocator::allocate_memory_oob(this_00,0x40,&local_28);
        if (pxVar5 == (xml_node_struct *)0x0) {
          return (xml_node)(xml_node_struct *)0x0;
        }
      }
      pxVar5->prev_sibling_c = (xml_node_struct *)0x0;
      pxVar5->next_sibling = (xml_node_struct *)0x0;
      pxVar5->parent = (xml_node_struct *)0x0;
      pxVar5->first_child = (xml_node_struct *)0x0;
      pxVar5->name = (char_t *)0x0;
      pxVar5->value = (char_t *)0x0;
      pxVar5->first_attribute = (xml_attribute_struct *)0x0;
      pxVar5->header = (ulong)uVar8 | ((long)pxVar5 - (long)local_28) * 0x100;
      pxVar2 = node->_root;
      pxVar3 = pxVar2->parent;
      pxVar5->parent = pxVar3;
      pxVar4 = pxVar2->prev_sibling_c;
      ppxVar6 = &pxVar3->first_child;
      if (pxVar4->next_sibling != (xml_node_struct *)0x0) {
        ppxVar6 = &pxVar4->next_sibling;
      }
      *ppxVar6 = pxVar5;
      pxVar5->prev_sibling_c = pxVar4;
      pxVar5->next_sibling = pxVar2;
      pxVar2->prev_sibling_c = pxVar5;
      impl::anon_unknown_0::node_copy_tree(pxVar5,proto->_root);
      return (xml_node)pxVar5;
    }
  }
  return (xml_node)(xml_node_struct *)0x0;
}

Assistant:

PUGI__FN xml_node xml_node::insert_copy_before(const xml_node& proto, const xml_node& node)
	{
		xml_node_type type_ = proto.type();
		if (!impl::allow_insert_child(type(), type_)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::insert_node_before(n._root, node._root);
		impl::node_copy_tree(n._root, proto._root);

		return n;
	}